

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::half>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,half *v)

{
  bool bVar1;
  value_type *pvVar2;
  optional<tinyusdz::value::half> local_4c;
  optional<tinyusdz::value::half> local_48;
  uint local_44;
  optional<tinyusdz::value::half> pv_1;
  optional<tinyusdz::value::half> local_3c;
  optional<tinyusdz::value::half> pv;
  half *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (half *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_002cdb88;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)&stack0xffffffffffffffc8,t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&stack0xffffffffffffffc8);
  if (bVar1) {
    get_default_value<tinyusdz::value::half>(&pv_1,this);
    nonstd::optional_lite::optional<tinyusdz::value::half>::optional<tinyusdz::value::half,_0>
              (&local_3c,&pv_1);
    nonstd::optional_lite::optional<tinyusdz::value::half>::~optional(&pv_1);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_3c);
    if (bVar1) {
      pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::half>::value(&local_3c);
      v->value = pvVar2->value;
      this_local._7_1_ = 1;
    }
    local_44 = (uint)bVar1;
    nonstd::optional_lite::optional<tinyusdz::value::half>::~optional(&local_3c);
    if (local_44 != 0) goto LAB_002cdb88;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_002cdb88;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<tinyusdz::value::half,_nullptr>(&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<tinyusdz::value::half>(&local_4c,this);
      nonstd::optional_lite::optional<tinyusdz::value::half>::optional<tinyusdz::value::half,_0>
                (&local_48,&local_4c);
      nonstd::optional_lite::optional<tinyusdz::value::half>::~optional(&local_4c);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_48);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::half>::value(&local_48);
        v->value = pvVar2->value;
        this_local._7_1_ = 1;
      }
      local_44 = (uint)bVar1;
      nonstd::optional_lite::optional<tinyusdz::value::half>::~optional(&local_48);
      if (local_44 != 0) goto LAB_002cdb88;
    }
    this_local._7_1_ = 0;
  }
LAB_002cdb88:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }